

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall embree::SubdivMesh::~SubdivMesh(SubdivMesh *this)

{
  EdgeCreaseMap *pEVar1;
  void *pvVar2;
  VertexCreaseMap *pVVar3;
  pointer pRVar4;
  char *ptr;
  MemoryMonitorInterface *pMVar5;
  HoleSet *pHVar6;
  size_t sVar7;
  uint *puVar8;
  Buffer *pBVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_0220e3b8;
  pEVar1 = (this->edgeCreaseMap)._M_t.
           super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>
           .super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl;
  if (pEVar1 != (EdgeCreaseMap *)0x0) {
    pvVar2 = *(void **)&(pEVar1->edgeCreaseMap).vec;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    operator_delete(pEVar1);
  }
  (this->edgeCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>._M_t.
  super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>.
  super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl = (EdgeCreaseMap *)0x0;
  pVVar3 = (this->vertexCreaseMap)._M_t.
           super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>
           .super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl;
  if (pVVar3 != (VertexCreaseMap *)0x0) {
    pvVar2 = *(void **)&(pVVar3->vertexCreaseMap).vec;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    operator_delete(pVVar3);
  }
  (this->vertexCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>._M_t
  .super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>.
  super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl = (VertexCreaseMap *)0x0;
  pRVar4 = (this->patch_eval_trees).
           super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar4 != (pointer)0x0) {
    operator_delete(pRVar4);
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_attrib_buffer_tags);
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_buffer_tags);
  uVar12 = (this->invalid_face).size_alloced;
  ptr = (this->invalid_face).items;
  if (ptr != (char *)0x0) {
    if (uVar12 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,uVar12,(this->invalid_face).alloc.hugepages);
    }
  }
  if (uVar12 != 0) {
    pMVar5 = (this->invalid_face).alloc.device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,-uVar12,1);
  }
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  pHVar6 = (this->holeSet)._M_t.
           super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>._M_t.
           super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
           super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl;
  if (pHVar6 != (HoleSet *)0x0) {
    pvVar2 = *(void **)&(pHVar6->holeSet).vec;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    operator_delete(pHVar6);
  }
  (this->holeSet)._M_t.super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>
  ._M_t.super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
  super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl = (HoleSet *)0x0;
  sVar7 = (this->halfEdgeFace).size_alloced;
  puVar8 = (this->halfEdgeFace).items;
  if (puVar8 != (uint *)0x0) {
    if (sVar7 * 4 < 0x1c00000) {
      alignedFree(puVar8);
    }
    else {
      os_free(puVar8,sVar7 * 4,(this->halfEdgeFace).alloc.hugepages);
    }
  }
  if (sVar7 != 0) {
    pMVar5 = (this->halfEdgeFace).alloc.device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar7 * -4,1);
  }
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  (this->halfEdgeFace).items = (uint *)0x0;
  sVar7 = (this->faceStartEdge).size_alloced;
  puVar8 = (this->faceStartEdge).items;
  if (puVar8 != (uint *)0x0) {
    if (sVar7 * 4 < 0x1c00000) {
      alignedFree(puVar8);
    }
    else {
      os_free(puVar8,sVar7 * 4,(this->faceStartEdge).alloc.hugepages);
    }
  }
  if (sVar7 != 0) {
    pMVar5 = (this->faceStartEdge).alloc.device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar7 * -4,1);
  }
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->faceStartEdge).items = (uint *)0x0;
  pBVar9 = (this->holes).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar9 = (this->levels).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar9 = (this->vertex_crease_weights).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar9 = (this->vertex_creases).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar9 = (this->edge_crease_weights).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar9 = (this->edge_creases).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  if ((this->vertexAttribs).size_active != 0) {
    lVar11 = 0x30;
    uVar12 = 0;
    do {
      plVar10 = *(long **)((long)&((this->vertexAttribs).items)->ptr_ofs + lVar11);
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 0x18))();
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x38;
    } while (uVar12 < (this->vertexAttribs).size_active);
  }
  operator_delete((this->vertexAttribs).items);
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  if ((this->vertices).size_active != 0) {
    lVar11 = 0x30;
    uVar12 = 0;
    do {
      plVar10 = *(long **)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar11);
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 0x18))();
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x38;
    } while (uVar12 < (this->vertices).size_active);
  }
  operator_delete((this->vertices).items);
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  if ((this->topology).size_active != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      Topology::~Topology((Topology *)((long)&((this->topology).items)->mesh + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0xa0;
    } while (uVar12 < (this->topology).size_active);
  }
  operator_delete((this->topology).items);
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  pBVar9 = (this->faceVertices).super_RawBufferView.buffer.ptr;
  if (pBVar9 != (Buffer *)0x0) {
    (*(pBVar9->super_RefCount)._vptr_RefCount[3])();
  }
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

SubdivMesh::~SubdivMesh() {}